

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O3

bool RigidBodyDynamics::Math::SpatialVectorCompareEpsilon
               (SpatialVector *vector_a,SpatialVector *vector_b,double epsilon)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ostream *poVar4;
  bool bVar5;
  
  if (epsilon <=
      ABS((vector_a->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] -
          (vector_b->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0])) {
    bVar5 = false;
  }
  else {
    uVar3 = 0xffffffffffffffff;
    do {
      if (uVar3 == 4) {
        return true;
      }
      lVar1 = uVar3 + 2;
      lVar2 = uVar3 + 2;
      uVar3 = uVar3 + 1;
    } while (ABS((vector_a->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [lVar1] - (vector_b->super_Matrix<double,_6,_1,_0,_6,_1>).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[lVar2]) < epsilon);
    bVar5 = 4 < uVar3;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Expected:",9);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
  std::ostream::put('h');
  poVar4 = (ostream *)std::ostream::flush();
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)vector_a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"but was",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)vector_b);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return bVar5;
}

Assistant:

RBDL_DLLAPI
bool SpatialVectorCompareEpsilon (const SpatialVector &vector_a, const SpatialVector &vector_b, double epsilon) {
	assert (epsilon >= 0.);
	unsigned int i;

	for (i = 0; i < 6; i++) {
		if (fabs(vector_a[i] - vector_b[i]) >= epsilon) {
			std::cerr << "Expected:" 
				<< std::endl << vector_a << std::endl
				<< "but was" << std::endl 
				<< vector_b << std::endl;
			return false;
		}
	}

	return true;
}